

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O1

void __thiscall AixLog::Filter::add_filter(Filter *this,Severity severity)

{
  mapped_type *pmVar1;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  bool local_28;
  
  local_50 = (undefined1  [8])&PTR__Tag_001edee0;
  local_48._M_p = (pointer)&local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"*","");
  local_28 = false;
  pmVar1 = std::
           map<AixLog::Tag,_AixLog::Severity,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
           ::operator[](&this->tag_filter_,(key_type *)local_50);
  *pmVar1 = severity;
  local_50 = (undefined1  [8])&PTR__Tag_001edee0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void add_filter(Severity severity) { tag_filter_["*"] = severity; }